

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O1

bool FIX::Message::isTrailerField(int field,DataDictionary *pD)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  bool bVar4;
  
  bVar4 = true;
  if (((field != 10) && (field != 0x59)) && (field != 0x5d)) {
    if (pD == (DataDictionary *)0x0) {
      return false;
    }
    p_Var3 = &(pD->m_trailerFields)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = (pD->m_trailerFields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &p_Var3->_M_header;
    for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < field]) {
      if (field <= (int)p_Var2[1]._M_color) {
        p_Var1 = p_Var2;
      }
    }
    p_Var2 = &p_Var3->_M_header;
    if (((_Rb_tree_header *)p_Var1 != p_Var3) && (p_Var2 = p_Var1, field < (int)p_Var1[1]._M_color))
    {
      p_Var2 = &p_Var3->_M_header;
    }
    bVar4 = (_Rb_tree_header *)p_Var2 != p_Var3;
  }
  return bVar4;
}

Assistant:

bool Message::isTrailerField(int field, const DataDictionary *pD) {
  if (isTrailerField(field)) {
    return true;
  }
  if (pD) {
    return pD->isTrailerField(field);
  }
  return false;
}